

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setOp.cpp
# Opt level: O0

ExprPtr __thiscall mathiu::impl::union_(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  ostream *poVar1;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  *in_RCX;
  Wildcard *patterns_1;
  ExprPtr *ex;
  ExprPtr *ex_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar2;
  PatternHelper<matchit::impl::Wildcard> local_2c49;
  anon_class_16_2_441c8d4f local_2c48;
  PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:231:27)>
  local_2c38;
  Id<mathiu::impl::Union> local_2c20;
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  local_2bd8;
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  local_2b70;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  local_2ae8;
  Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>,_matchit::impl::Wildcard>
  local_2a48;
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>,_matchit::impl::Wildcard>_>
  local_29a8;
  anon_class_16_2_f8c87f18 local_2908;
  PatternPair<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:229:68)>
  local_28f8;
  Id<mathiu::impl::Union> local_2848;
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  local_2800;
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  local_2798;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  local_2710;
  Ds<matchit::impl::Wildcard,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>_>
  local_2670;
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>_>_>
  local_25d0;
  anon_class_16_2_f8c5c4de local_2530;
  PatternPair<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:229:68)>
  local_2520;
  Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>
  local_246c;
  And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>
  local_2468;
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>
  local_2418;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>_>
  local_23a8;
  Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>
  local_231c;
  And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>
  local_2318;
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>
  local_22c8;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>_>
  local_2258;
  Ds<_721216d8_> local_21d0;
  App<_ec2ddf43_> local_20c0;
  App<_6b4b7db2_> local_1f90;
  And<_e2aacf77_> local_1e40;
  Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>
  local_1cd4;
  And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>
  local_1cd0;
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>
  local_1c80;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>_>
  local_1c10;
  Ds<_125b34a2_> local_1b88;
  PatternHelper<_2a907c21_> local_1998;
  anon_class_24_3_40ded20b local_17a8;
  PatternPair<_aed55613_> local_1790;
  Id<mathiu::impl::Union> local_1588;
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  local_1540;
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  local_14d8;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  local_1450;
  Id<mathiu::impl::Union> local_13b0;
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  local_1368;
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  local_1300;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  local_1278;
  Ds<_342bf3fa_> local_11d8;
  PatternHelper<_1b888f9f_> local_1098;
  anon_class_16_2_44a1754a local_f58;
  undefined1 local_f48 [376];
  undefined1 local_dd0 [24];
  Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard> local_db8;
  PatternHelper<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>_>
  local_da8;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>
  local_d98;
  PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
  local_d90;
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  local_d78;
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>
  local_d30;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>
  local_cc8;
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  local_c48;
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>
  local_c00;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>
  local_b98;
  Ds<_ac0dcf8c_> local_b18;
  PatternHelper<_213c5cb1_> local_a18;
  anon_class_16_2_de5d96fa local_918;
  PatternPair<_1fc96c08_> local_908;
  Id<mathiu::impl::Set> local_7f8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_7b0;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>
  local_748;
  Id<mathiu::impl::Set> local_6c8;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_680;
  And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>
  local_618;
  Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>_>
  local_598;
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>_>_>
  local_498;
  anon_class_16_2_a84cc0ea local_398;
  PatternPair<_1fc96c08_> local_388;
  undefined1 local_278 [24];
  Id<mathiu::impl::Union> iUnion2;
  Id<mathiu::impl::Union> iUnion1;
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  iInterval3;
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  iInterval2;
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  iInterval1;
  Id<mathiu::impl::Set> iSet2;
  Id<mathiu::impl::Set> iSet1;
  string local_40;
  impl *local_20;
  ExprPtr *rhs_local;
  ExprPtr *lhs_local;
  
  local_20 = (impl *)rhs;
  rhs_local = lhs;
  lhs_local = (ExprPtr *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"union_: ");
  toString_abi_cxx11_(&local_40,(impl *)rhs_local,ex);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,",\t");
  toString_abi_cxx11_((string *)
                      ((long)&iSet1.mBlock.
                              super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                              .
                              super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                              .
                              super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                              .
                              super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                              .
                              super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                      + 0x40),local_20,ex_00);
  poVar1 = std::operator<<(poVar1,(string *)
                                  ((long)&iSet1.mBlock.
                                          super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                          .
                                          super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                          .
                                          super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                          .
                                          super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                          .
                                          super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                  + 0x40));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((string *)
             ((long)&iSet1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
             + 0x40));
  std::__cxx11::string::~string((string *)&local_40);
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)
             ((long)&iSet2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
             + 0x40));
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)
             ((long)&iInterval1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
             + 0x40));
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::Id((Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iInterval2.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
          + 0x40));
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::Id((Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iInterval3.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
          + 0x40));
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::Id((Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iUnion1.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
          + 0x40));
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)
             ((long)&iUnion2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
             + 0x40));
  matchit::impl::Id<mathiu::impl::Union>::Id((Id<mathiu::impl::Union> *)(local_278 + 0x10));
  matchit::impl::
  match<std::shared_ptr<mathiu::impl::Expr_const>const&,std::shared_ptr<mathiu::impl::Expr_const>const&>
            ((impl *)local_278,rhs_local,(shared_ptr<const_mathiu::impl::Expr> *)local_20);
  local_398.iSet1 =
       (Id<mathiu::impl::Set> *)
       ((long)&iSet2.mBlock.
               super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
       + 0x40);
  local_398.iSet2 =
       (Id<mathiu::impl::Set> *)
       ((long)&iInterval1.mBlock.
               super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
       + 0x40);
  matchit::impl::Id<mathiu::impl::Set>::Id(&local_6c8,local_398.iSet1);
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_680,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,&local_6c8);
  matchit::impl::$_2::operator()(&local_618,(__2 *)&matchit::impl::some,&local_680);
  matchit::impl::Id<mathiu::impl::Set>::Id
            (&local_7f8,
             (Id<mathiu::impl::Set> *)
             ((long)&iInterval1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
             + 0x40));
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_7b0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,&local_7f8);
  matchit::impl::$_2::operator()(&local_748,(__2 *)&matchit::impl::some,&local_7b0);
  matchit::impl::
  ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>>>
            (&local_598,(impl *)&local_618,&local_748,
             (And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>
              *)in_RCX);
  matchit::impl::PatternPipable::operator|
            (&local_498,(PatternPipable *)&matchit::impl::pattern,&local_598);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>>>>
  ::operator=((PatternPair<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:210:72)>
               *)&local_388,
              (PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>>>>
               *)&local_498,&local_398);
  local_918.iInterval1 =
       (Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iInterval2.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
          + 0x40);
  local_918.iInterval2 =
       (Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iInterval3.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
          + 0x40);
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::Id(&local_c48,local_918.iInterval1);
  matchit::impl::
  as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ::{lambda(auto:1)#1}::operator()
            (&local_c00,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
             ,&local_c48);
  matchit::impl::$_2::operator()(&local_b98,(__2 *)&matchit::impl::some,&local_c00);
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::Id(&local_d78,
       (Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iInterval3.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
          + 0x40));
  matchit::impl::
  as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ::{lambda(auto:1)#1}::operator()
            (&local_d30,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
             ,&local_d78);
  matchit::impl::$_2::operator()(&local_cc8,(__2 *)&matchit::impl::some,&local_d30);
  matchit::impl::
  ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>
            (&local_b18,(impl *)&local_b98,&local_cc8,
             (And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>
              *)in_RCX);
  matchit::impl::PatternPipable::operator|
            (&local_a18,(PatternPipable *)&matchit::impl::pattern,&local_b18);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>>
  ::operator=(&local_908,
              (PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>>
               *)&local_a18,&local_918);
  local_d98 = matchit::impl::expr<std::shared_ptr<mathiu::impl::Expr_const>>
                        ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  matchit::impl::ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>
            ((impl *)&local_db8,(shared_ptr<const_mathiu::impl::Expr> *)false_,
             (Wildcard *)&matchit::impl::_);
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&local_da8,
             (Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard> *)
             &matchit::impl::pattern);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>>
  ::operator=((PatternPair<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
               *)&local_d90,
              (PatternHelper<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,matchit::impl::Wildcard>>
               *)&local_da8,&local_d98);
  local_f48._368_8_ = matchit::impl::expr<std::shared_ptr<mathiu::impl::Expr_const>>(rhs_local);
  matchit::impl::ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>
            ((impl *)(local_f48 + 0x150),(Wildcard *)&matchit::impl::_,
             (shared_ptr<const_mathiu::impl::Expr> *)false_);
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)(local_f48 + 0x160),
             (Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_> *)
             &matchit::impl::pattern);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>
  ::operator=((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
               *)local_dd0,
              (PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,std::shared_ptr<mathiu::impl::Expr_const>>>
               *)(local_f48 + 0x160),
              (Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>
               *)(local_f48 + 0x170));
  local_f58.iUnion1 =
       (Id<mathiu::impl::Union> *)
       ((long)&iUnion2.mBlock.
               super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
       + 0x40);
  local_f58.iUnion2 = (Id<mathiu::impl::Union> *)(local_278 + 0x10);
  matchit::impl::Id<mathiu::impl::Union>::Id(&local_13b0,local_f58.iUnion1);
  matchit::impl::as<mathiu::impl::Union>::{lambda(auto:1)#1}::operator()
            (&local_1368,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Union>,&local_13b0);
  matchit::impl::as<mathiu::impl::SetOp>::{lambda(auto:1)#1}::operator()
            (&local_1300,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::SetOp>,&local_1368);
  matchit::impl::$_2::operator()(&local_1278,(__2 *)&matchit::impl::some,&local_1300);
  matchit::impl::Id<mathiu::impl::Union>::Id
            (&local_1588,(Id<mathiu::impl::Union> *)(local_278 + 0x10));
  matchit::impl::as<mathiu::impl::Union>::{lambda(auto:1)#1}::operator()
            (&local_1540,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Union>,&local_1588);
  matchit::impl::as<mathiu::impl::SetOp>::{lambda(auto:1)#1}::operator()
            (&local_14d8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::SetOp>,&local_1540);
  matchit::impl::$_2::operator()(&local_1450,(__2 *)&matchit::impl::some,&local_14d8);
  matchit::impl::
  ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>>
            (&local_11d8,(impl *)&local_1278,&local_1450,in_RCX);
  matchit::impl::PatternPipable::operator|
            (&local_1098,(PatternPipable *)&matchit::impl::pattern,&local_11d8);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>>>
  ::operator=((PatternPair<_acab5191_> *)local_f48,
              (PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>>>
               *)&local_1098,&local_f58);
  local_17a8.iInterval1 =
       (Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iInterval2.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
          + 0x40);
  local_17a8.iInterval2 =
       (Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iInterval3.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
          + 0x40);
  local_17a8.iInterval3 =
       (Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
        *)((long)&iUnion1.mBlock.
                  super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                  .
                  super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                  .
                  super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                  .
                  super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                  .
                  super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
          + 0x40);
  realInterval::{lambda(auto:1&&,auto:2&&)#1}::operator()
            (&local_1cd4,&realInterval,(Wildcard *)&matchit::impl::_,(Wildcard *)&matchit::impl::_);
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ::
  at<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>,matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>>>
            (&local_1cd0,
             (Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
              *)((long)&iInterval2.mBlock.
                        super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                        .
                        super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                        .
                        super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                        .
                        super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                        .
                        super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                + 0x40),&local_1cd4);
  matchit::impl::
  as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ::{lambda(auto:1)#1}::operator()
            (&local_1c80,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
             ,&local_1cd0);
  matchit::impl::$_2::operator()(&local_1c10,(__2 *)&matchit::impl::some,&local_1c80);
  realInterval::{lambda(auto:1&&,auto:2&&)#1}::operator()
            (&local_231c,&realInterval,(Wildcard *)&matchit::impl::_,(Wildcard *)&matchit::impl::_);
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ::
  at<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>,matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>>>
            (&local_2318,
             (Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
              *)((long)&iInterval3.mBlock.
                        super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                        .
                        super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                        .
                        super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                        .
                        super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                        .
                        super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                + 0x40),&local_231c);
  matchit::impl::
  as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ::{lambda(auto:1)#1}::operator()
            (&local_22c8,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
             ,&local_2318);
  matchit::impl::$_2::operator()(&local_2258,(__2 *)&matchit::impl::some,&local_22c8);
  patterns_1 = (Wildcard *)&matchit::impl::_;
  realInterval::{lambda(auto:1&&,auto:2&&)#1}::operator()
            (&local_246c,&realInterval,(Wildcard *)&matchit::impl::_,(Wildcard *)&matchit::impl::_);
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ::
  at<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>,matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>>>
            (&local_2468,
             (Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
              *)((long)&iUnion1.mBlock.
                        super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                        .
                        super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                        .
                        super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                        .
                        super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                        .
                        super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                + 0x40),&local_246c);
  matchit::impl::
  as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ::{lambda(auto:1)#1}::operator()
            (&local_2418,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
             ,&local_2468);
  matchit::impl::$_2::operator()(&local_23a8,(__2 *)&matchit::impl::some,&local_2418);
  matchit::impl::
  ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>,matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>>,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>,matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>>,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>>
            (&local_21d0,(impl *)&local_2258,&local_23a8,
             (And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>_>
              *)patterns_1);
  matchit::impl::as<mathiu::impl::Union>::{lambda(auto:1)#1}::operator()
            (&local_20c0,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Union>,&local_21d0);
  matchit::impl::as<mathiu::impl::SetOp>::{lambda(auto:1)#1}::operator()
            (&local_1f90,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::SetOp>,&local_20c0);
  matchit::impl::$_2::operator()(&local_1e40,(__2 *)&matchit::impl::some,&local_1f90);
  matchit::impl::
  ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>,matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>>,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>,matchit::impl::And<matchit::impl::App___:impl::Expr_const>,bool>_std__pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>>>>>>>>>>>
            (&local_1b88,(impl *)&local_1c10,
             (And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_internal_h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>_>
              *)&local_1e40,(And<_e2aacf77_> *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_1998,(PatternPipable *)&matchit::impl::pattern,&local_1b88);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::{lambda(auto:1&&)#1}>,matchit::impl::Wildcard>,matchit::impl::Wildcard>,matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::{lambda(auto:1&&)#1}>,matchit::impl::Wildcard>,matchit::impl::Wildcard>>,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>,matchit:...impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>>>>>>>>>>>>
  ::operator=(&local_1790,
              (PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>,matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::asDouble::_lambda(auto:1&&)_1_>,matchit::impl::Wildcard>,matchit::impl::Wildcard>>,matchit::impl::Id<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>,matchit:___impl::Expr_const>,bool>_std__pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>>>>>>>>>>>>>>>>>>
               *)&local_1998,&local_17a8);
  local_2530.lhs = rhs_local;
  local_2530.iUnion2 = (Id<mathiu::impl::Union> *)(local_278 + 0x10);
  matchit::impl::Id<mathiu::impl::Union>::Id(&local_2848,local_2530.iUnion2);
  matchit::impl::as<mathiu::impl::Union>::{lambda(auto:1)#1}::operator()
            (&local_2800,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Union>,&local_2848);
  matchit::impl::as<mathiu::impl::SetOp>::{lambda(auto:1)#1}::operator()
            (&local_2798,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::SetOp>,&local_2800);
  matchit::impl::$_2::operator()(&local_2710,(__2 *)&matchit::impl::some,&local_2798);
  matchit::impl::
  ds<matchit::impl::Wildcard,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>>
            (&local_2670,(impl *)&matchit::impl::_,(Wildcard *)&local_2710,
             (And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
              *)patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_25d0,(PatternPipable *)&matchit::impl::pattern,&local_2670);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>>>
  ::operator=((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:227:68)>
               *)&local_2520,
              (PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>>>
               *)&local_25d0,&local_2530);
  local_2908.rhs = (ExprPtr *)local_20;
  local_2908.iUnion2 = (Id<mathiu::impl::Union> *)(local_278 + 0x10);
  matchit::impl::Id<mathiu::impl::Union>::Id
            (&local_2c20,
             (Id<mathiu::impl::Union> *)
             ((long)&iUnion2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
             + 0x40));
  matchit::impl::as<mathiu::impl::Union>::{lambda(auto:1)#1}::operator()
            (&local_2bd8,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Union>,&local_2c20);
  matchit::impl::as<mathiu::impl::SetOp>::{lambda(auto:1)#1}::operator()
            (&local_2b70,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::SetOp>,&local_2bd8);
  matchit::impl::$_2::operator()(&local_2ae8,(__2 *)&matchit::impl::some,&local_2b70);
  matchit::impl::
  ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>,matchit::impl::Wildcard>
            (&local_2a48,(impl *)&local_2ae8,
             (And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
              *)&matchit::impl::_,patterns_1);
  matchit::impl::PatternPipable::operator|
            (&local_29a8,(PatternPipable *)&matchit::impl::pattern,&local_2a48);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>,matchit::impl::Wildcard>>
  ::operator=(&local_28f8,
              (PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::SetOp>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Union>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Union>>>>>>>>>,matchit::impl::Wildcard>>
               *)&local_29a8,&local_2908);
  local_2c48.lhs = rhs_local;
  local_2c48.rhs = (ExprPtr *)local_20;
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
  matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator=
            (&local_2c38,&local_2c49,&local_2c48);
  matchit::impl::
  MatchHelper<std::tuple<const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_false>
  ::operator()<_38e07f58_>
            ((MatchHelper<std::tuple<const_std::shared_ptr<const_mathiu::impl::Expr>_&,_const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_false>
              *)this,(PatternPair<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:210:72)>
                      *)local_278,&local_388,
             (PatternPair<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
              *)&local_908,&local_d90,(PatternPair<_acab5191_> *)local_dd0,
             (PatternPair<_aed55613_> *)local_f48,
             (PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:227:68)>
              *)&local_1790,&local_2520,
             (PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:231:27)>
              *)&local_28f8);
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>,_matchit::impl::Wildcard>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/setOp.cpp:229:68)>
  ::~PatternPair(&local_28f8);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>,_matchit::impl::Wildcard>_>
  ::~PatternHelper(&local_29a8);
  matchit::impl::
  Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>,_matchit::impl::Wildcard>
  ::~Ds(&local_2a48);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  ::~And(&local_2ae8);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  ::~App(&local_2b70);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  ::~App(&local_2bd8);
  matchit::impl::Id<mathiu::impl::Union>::~Id(&local_2c20);
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/setOp.cpp:227:68)>
  ::~PatternPair((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:227:68)>
                  *)&local_2520);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>_>_>
  ::~PatternHelper(&local_25d0);
  matchit::impl::
  Ds<matchit::impl::Wildcard,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>_>
  ::~Ds(&local_2670);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  ::~And(&local_2710);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  ::~App(&local_2798);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  ::~App(&local_2800);
  matchit::impl::Id<mathiu::impl::Union>::~Id(&local_2848);
  matchit::impl::PatternPair<$aed55613$>::~PatternPair(&local_1790);
  matchit::impl::PatternHelper<$2a907c21$>::~PatternHelper(&local_1998);
  matchit::impl::Ds<$125b34a2$>::~Ds(&local_1b88);
  matchit::impl::And<$e2aacf77$>::~And(&local_1e40);
  matchit::impl::App<$6b4b7db2$>::~App(&local_1f90);
  matchit::impl::App<$ec2ddf43$>::~App(&local_20c0);
  matchit::impl::Ds<$721216d8$>::~Ds(&local_21d0);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>_>
  ::~And(&local_23a8);
  matchit::impl::
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>
  ::~App(&local_2418);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>
  ::~And(&local_2468);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>_>
  ::~And(&local_2258);
  matchit::impl::
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>
  ::~App(&local_22c8);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>
  ::~And(&local_2318);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>_>
  ::~And(&local_1c10);
  matchit::impl::
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>
  ::~App(&local_1c80);
  matchit::impl::
  And<matchit::impl::Ds<matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>,_matchit::impl::And<matchit::impl::Ds<matchit::impl::Meet<mathiu::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/internal.h:63:52)>,_matchit::impl::Wildcard>,_matchit::impl::Wildcard>_>,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>
  ::~And(&local_1cd0);
  matchit::impl::PatternPair<$acab5191$>::~PatternPair((PatternPair<_acab5191_> *)local_f48);
  matchit::impl::PatternHelper<$1b888f9f$>::~PatternHelper(&local_1098);
  matchit::impl::Ds<$342bf3fa$>::~Ds(&local_11d8);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  ::~And(&local_1450);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  ::~App(&local_14d8);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  ::~App(&local_1540);
  matchit::impl::Id<mathiu::impl::Union>::~Id(&local_1588);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>_>_>
  ::~And(&local_1278);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::SetOp>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>_>_>_>
  ::~App(&local_1300);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
  ::~App(&local_1368);
  matchit::impl::Id<mathiu::impl::Union>::~Id(&local_13b0);
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Nullary<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:110:28)>_>
  ::~PatternPair((PatternPair<matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
                  *)local_dd0);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~PatternHelper((PatternHelper<matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
                    *)(local_f48 + 0x160));
  matchit::impl::Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_>::~Ds
            ((Ds<matchit::impl::Wildcard,_std::shared_ptr<const_mathiu::impl::Expr>_> *)
             (local_f48 + 0x150));
  matchit::impl::
  PatternPair<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Nullary<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:110:28)>_>
  ::~PatternPair((PatternPair<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>,_matchit::impl::Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:110:28)>_>
                  *)&local_d90);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>_>
  ::~PatternHelper(&local_da8);
  matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_matchit::impl::Wildcard>::~Ds
            (&local_db8);
  matchit::impl::PatternPair<$1fc96c08$>::~PatternPair(&local_908);
  matchit::impl::PatternHelper<$213c5cb1$>::~PatternHelper(&local_a18);
  matchit::impl::Ds<$ac0dcf8c$>::~Ds(&local_b18);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>
  ::~And(&local_cc8);
  matchit::impl::
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>
  ::~App(&local_d30);
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::~Id(&local_d78);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>_>_>
  ::~And(&local_b98);
  matchit::impl::
  App<const_matchit::impl::AsPointer<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_>_>_>
  ::~App(&local_c00);
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::~Id(&local_c48);
  matchit::impl::
  PatternPair<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/setOp.cpp:210:72)>
  ::~PatternPair((PatternPair<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_setOp_cpp:210:72)>
                  *)&local_388);
  matchit::impl::
  PatternHelper<matchit::impl::Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>_>_>
  ::~PatternHelper(&local_498);
  matchit::impl::
  Ds<matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>_>
  ::~Ds(&local_598);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>
  ::~And(&local_748);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  ::~App(&local_7b0);
  matchit::impl::Id<mathiu::impl::Set>::~Id(&local_7f8);
  matchit::impl::
  And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>_>
  ::~And(&local_618);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  ::~App(&local_680);
  matchit::impl::Id<mathiu::impl::Set>::~Id(&local_6c8);
  matchit::impl::Id<mathiu::impl::Union>::~Id((Id<mathiu::impl::Union> *)(local_278 + 0x10));
  matchit::impl::Id<mathiu::impl::Union>::~Id
            ((Id<mathiu::impl::Union> *)
             ((long)&iUnion2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
             + 0x40));
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::~Id((Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
         *)((long)&iUnion1.mBlock.
                   super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                   .
                   super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                   .
                   super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                   .
                   super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                   .
                   super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
           + 0x40));
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::~Id((Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
         *)((long)&iInterval3.mBlock.
                   super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                   .
                   super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                   .
                   super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                   .
                   super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                   .
                   super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
           + 0x40));
  matchit::impl::
  Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
  ::~Id((Id<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>
         *)((long)&iInterval2.mBlock.
                   super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                   .
                   super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                   .
                   super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                   .
                   super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                   .
                   super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
           + 0x40));
  matchit::impl::Id<mathiu::impl::Set>::~Id
            ((Id<mathiu::impl::Set> *)
             ((long)&iInterval1.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>,_matchit::impl::IdBlock<std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_>_*>
             + 0x40));
  matchit::impl::Id<mathiu::impl::Set>::~Id
            ((Id<mathiu::impl::Set> *)
             ((long)&iSet2.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
             + 0x40));
  EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ExprPtr)EVar2.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr union_(ExprPtr const &lhs, ExprPtr const &rhs)
    {
#if DEBUG
        std::cout << "union_: " << toString(lhs) << ",\t" << toString(rhs) << std::endl;
#endif // DEBUG

        Id<Set> iSet1, iSet2;
        Id<Interval> iInterval1, iInterval2, iInterval3;
        Id<Union> iUnion1, iUnion2;
        return match(lhs, rhs)(
            pattern | ds(some(as<Set>(iSet1)), some(as<Set>(iSet2))) = [&]
            {
                Set solutions1 = *iSet1;
                Set solutions2 = *iSet2;
                solutions1.merge(solutions2);
                return makeSharedExprPtr(std::move(solutions1));
            },
            pattern | ds(some(as<Interval>(iInterval1)), some(as<Interval>(iInterval2))) = [&]
            { return unionInterval(*iInterval1, *iInterval2); },
            pattern | ds(false_, _) = expr(rhs), pattern | ds(_, false_) = expr(lhs), pattern | ds(some(as<SetOp>(as<Union>(iUnion1))), some(as<SetOp>(as<Union>(iUnion2)))) = [&]
                                                                                      { return mergeUnion(*iUnion1, *iUnion2); },
            pattern | ds(some(as<Interval>(iInterval1.at(realInterval(_, _)))), some(as<SetOp>(as<Union>(ds(some(as<Interval>(iInterval2.at(realInterval(_, _)))), some(as<Interval>(iInterval3.at(realInterval(_, _))))))))) = [&]
            {
                auto result = unionInterval(*iInterval1, *iInterval2);
                auto newI = std::get<Interval>(*result);
                return unionInterval(newI, *iInterval3);
            },
            pattern | ds(_, some(as<SetOp>(as<Union>(iUnion2)))) = [&]
            { return mergeUnion(Union{{lhs}}, *iUnion2); },
            pattern | ds(some(as<SetOp>(as<Union>(iUnion1))), _) = [&]
            { return mergeUnion(Union{{rhs}}, *iUnion2); },
            pattern | _ = [&]
            { return makeSharedExprPtr(SetOp{Union{{lhs, rhs}}}); });
    }